

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Error::ToString_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  ErrorCode in_EDX;
  string *this_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->mCode == kNone) {
    ErrorCodeToString_abi_cxx11_(&local_30,(commissioner *)0x0,in_EDX);
    this_00 = &local_30;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
  }
  else {
    ErrorCodeToString_abi_cxx11_(&local_70,(commissioner *)(ulong)this->mCode,in_EDX);
    std::operator+(&local_50,&local_70,": ");
    std::operator+(&local_30,&local_50,&this->mMessage);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string Error::ToString() const
{
    std::string ret;
    if (GetCode() == ErrorCode::kNone)
    {
        ret = ErrorCodeToString(ErrorCode::kNone);
    }
    else
    {
        ret = ErrorCodeToString(GetCode()) + ": " + mMessage;
    }
    return ret;
}